

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O0

bool __thiscall QStyleSheetStyle::hasStyleRule(QStyleSheetStyle *this,QObject *obj,int part)

{
  QStringView other;
  bool bVar1;
  bool *pbVar2;
  QString *str;
  qsizetype qVar3;
  const_reference pSVar4;
  int in_EDX;
  long in_RSI;
  long in_FS_OFFSET;
  QStyleSheetStyle *unaff_retaddr;
  Selector *selector;
  int i;
  bool result;
  QList<QCss::StyleRule> *rules;
  QHash<int,_bool> *cache;
  QLatin1StringView pseudoElement;
  const_iterator cacheIt;
  QObject *in_stack_000004c8;
  QLatin1String *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  const_iterator *in_stack_ffffffffffffff28;
  undefined6 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff36;
  byte bVar5;
  undefined1 in_stack_ffffffffffffff37;
  byte bVar6;
  QObject *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  int iVar7;
  bool local_89;
  QList<QCss::StyleRule> local_50;
  piter local_38;
  piter local_28;
  int local_14;
  long local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_14 = in_EDX;
  local_10 = in_RSI;
  QHash<const_QObject_*,_QHash<int,_bool>_>::operator[]
            ((QHash<const_QObject_*,_QHash<int,_bool>_> *)
             CONCAT17(in_stack_ffffffffffffff37,
                      CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)),
             (QObject **)in_stack_ffffffffffffff28);
  local_28.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d = (Data<QHashPrivate::Node<int,_bool>_> *)&DAT_aaaaaaaaaaaaaaaa;
  local_28 = (piter)QHash<int,_bool>::constFind
                              ((QHash<int,_bool> *)
                               CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                               (int *)in_stack_ffffffffffffff18);
  local_38 = (piter)QHash<int,_bool>::constEnd((QHash<int,_bool> *)in_stack_ffffffffffffff28);
  bVar1 = QHash<int,_bool>::const_iterator::operator!=
                    (in_stack_ffffffffffffff28,
                     (const_iterator *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20)
                    );
  if (bVar1) {
    pbVar2 = QHash<int,_bool>::const_iterator::value((const_iterator *)0x428588);
    local_89 = (bool)(*pbVar2 & 1);
  }
  else {
    bVar1 = initObject((QStyleSheetStyle *)
                       CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                       in_stack_ffffffffffffff40);
    if (bVar1) {
      styleRules(unaff_retaddr,in_stack_000004c8);
      if (local_14 == 0) {
        bVar6 = 0;
        if (local_10 != 0) {
          bVar1 = QList<QCss::StyleRule>::isEmpty((QList<QCss::StyleRule> *)0x428610);
          bVar6 = bVar1 ^ 0xff;
        }
        local_89 = (bool)(bVar6 & 1);
        bVar5 = local_89;
        pbVar2 = QHash<int,_bool>::operator[]
                           ((QHash<int,_bool> *)
                            (CONCAT17(bVar6,CONCAT16(bVar6,in_stack_ffffffffffffff30)) &
                            0xff01ffffffffffff),(int *)in_stack_ffffffffffffff28);
        *pbVar2 = (bool)(bVar5 & 1);
      }
      else {
        QLatin1String::QLatin1String
                  ((QLatin1String *)
                   CONCAT17(in_stack_ffffffffffffff37,
                            CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)),
                   (char *)in_stack_ffffffffffffff28);
        iVar7 = 0;
        while( true ) {
          str = (QString *)(long)iVar7;
          qVar3 = QList<QCss::StyleRule>::size(&local_50);
          if (qVar3 <= (long)str) break;
          QList<QCss::StyleRule>::at
                    ((QList<QCss::StyleRule> *)
                     CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                     (qsizetype)in_stack_ffffffffffffff18);
          pSVar4 = QList<QCss::Selector>::at
                             ((QList<QCss::Selector> *)
                              CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                              (qsizetype)in_stack_ffffffffffffff18);
          QCss::Selector::pseudoElement();
          QStringView::QStringView<QString,_true>
                    ((QStringView *)
                     CONCAT17(in_stack_ffffffffffffff37,
                              CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)),str);
          other.m_data._0_4_ = in_stack_ffffffffffffff48;
          other.m_size = (qsizetype)pSVar4;
          other.m_data._4_4_ = iVar7;
          in_stack_ffffffffffffff24 =
               QLatin1String::compare(in_stack_ffffffffffffff18,other,CaseInsensitive);
          QString::~QString((QString *)0x428743);
          if (in_stack_ffffffffffffff24 == 0) {
            pbVar2 = QHash<int,_bool>::operator[]
                               ((QHash<int,_bool> *)
                                CONCAT17(in_stack_ffffffffffffff37,
                                         CONCAT16(in_stack_ffffffffffffff36,
                                                  in_stack_ffffffffffffff30)),(int *)str);
            *pbVar2 = true;
            local_89 = true;
            goto LAB_004287a4;
          }
          iVar7 = iVar7 + 1;
        }
        pbVar2 = QHash<int,_bool>::operator[]
                           ((QHash<int,_bool> *)
                            CONCAT17(in_stack_ffffffffffffff37,
                                     CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)),
                            (int *)str);
        *pbVar2 = false;
        local_89 = false;
      }
LAB_004287a4:
      QList<QCss::StyleRule>::~QList((QList<QCss::StyleRule> *)0x4287b1);
    }
    else {
      local_89 = false;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_89;
  }
  __stack_chk_fail();
}

Assistant:

bool QStyleSheetStyle::hasStyleRule(const QObject *obj, int part) const
{
    QHash<int, bool> &cache = styleSheetCaches->hasStyleRuleCache[obj];
    QHash<int, bool>::const_iterator cacheIt = cache.constFind(part);
    if (cacheIt != cache.constEnd())
        return cacheIt.value();

    if (!initObject(obj))
        return false;

    const QList<StyleRule> &rules = styleRules(obj);
    if (part == PseudoElement_None) {
        bool result = obj && !rules.isEmpty();
        cache[part] = result;
        return result;
    }

    auto pseudoElement = QLatin1StringView(knownPseudoElements[part].name);
    for (int i = 0; i < rules.size(); i++) {
        const Selector& selector = rules.at(i).selectors.at(0);
        if (pseudoElement.compare(selector.pseudoElement(), Qt::CaseInsensitive) == 0) {
            cache[part] = true;
            return true;
        }
    }

    cache[part] = false;
    return false;
}